

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ya_getopt.cc
# Opt level: O0

void check_gnu_extension(char *optstring)

{
  char *pcVar1;
  char *in_RDI;
  
  if ((*in_RDI == '+') || (pcVar1 = getenv("POSIXLY_CORRECT"), pcVar1 != (char *)0x0)) {
    posixly_correct = 1;
  }
  else {
    posixly_correct = 0;
  }
  handle_nonopt_argv = (int)(*in_RDI == '-');
  return;
}

Assistant:

static void check_gnu_extension(const char *optstring)
{
    if (optstring[0] == '+' || getenv("POSIXLY_CORRECT") != NULL) {
        posixly_correct = 1;
    } else {
        posixly_correct = 0;
    }
    if (optstring[0] == '-') {
        handle_nonopt_argv = 1;
    } else {
        handle_nonopt_argv = 0;
    }
}